

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Expression_*> *
wasm::WATParser::expr<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Expression_*> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  undefined8 *puVar1;
  undefined1 local_68 [8];
  Result<wasm::Ok> _val;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  instrs<wasm::WATParser::ParseDefsCtx>((Result<wasm::Ok> *)local_68,ctx);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = &local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),local_68,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_68);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Expression_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> = puVar1;
    if ((undefined8 *)
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == &local_30) {
      *puVar1 = local_30;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x18) = uStack_28;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> =
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x10) = local_30;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 8) = local_38;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
    ParseDefsCtx::makeExpr(__return_storage_ptr__,ctx);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::ExprT> expr(Ctx& ctx) {
  CHECK_ERR(instrs(ctx));
  return ctx.makeExpr();
}